

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_obj.cpp
# Opt level: O1

tri * load_obj(char *file_name,size_t *tri_count)

{
  tri *ptVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> tri_vec;
  allocator<char> local_51;
  vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> local_50;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,file_name,&local_51);
  load_obj<float>(&local_50,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  sVar3 = ((long)local_50.
                 super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_50.
                 super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x71c71c71c71c71c7;
  *tri_count = sVar3;
  if ((long)local_50.
            super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_50.
            super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0) {
    ptVar1 = (tri *)0x0;
  }
  else {
    ptVar1 = (tri *)malloc((long)local_50.
                                 super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_50.
                                 super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
    lVar4 = sVar3 + (sVar3 == 0);
    lVar2 = 0x20;
    do {
      *(undefined4 *)((long)ptVar1->v + lVar2 + -0x20) =
           *(undefined4 *)
            ((long)((local_50.
                     super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->p0).values + lVar2 + -0x20);
      *(undefined4 *)((long)ptVar1->v + lVar2 + -0x1c) =
           *(undefined4 *)
            ((long)((local_50.
                     super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->p0).values + lVar2 + -0x1c);
      *(undefined4 *)((long)(ptVar1->v + -2) + lVar2) =
           *(undefined4 *)
            ((long)(&(local_50.
                      super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->p0 + -2) + lVar2);
      *(undefined4 *)((long)ptVar1->v + lVar2 + -0x14) =
           *(undefined4 *)
            ((long)((local_50.
                     super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->p0).values + lVar2 + -0x14);
      *(undefined4 *)((long)ptVar1->v + lVar2 + -0x10) =
           *(undefined4 *)
            ((long)((local_50.
                     super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->p0).values + lVar2 + -0x10);
      *(undefined4 *)((long)(ptVar1->v + -1) + lVar2) =
           *(undefined4 *)
            ((long)(&(local_50.
                      super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->p0 + -1) + lVar2);
      *(undefined4 *)((long)ptVar1->v + lVar2 + -8) =
           *(undefined4 *)
            ((long)((local_50.
                     super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->p0).values + lVar2 + -8);
      *(undefined4 *)((long)ptVar1->v + lVar2 + -4) =
           *(undefined4 *)
            ((long)((local_50.
                     super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->p0).values + lVar2 + -4);
      *(undefined4 *)((long)&ptVar1->v[0].x + lVar2) =
           *(undefined4 *)
            ((long)((local_50.
                     super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->p0).values + lVar2);
      lVar2 = lVar2 + 0x24;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  if (local_50.
      super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return ptVar1;
}

Assistant:

tri* load_obj(const char* file_name, size_t* tri_count) {
    auto tri_vec = load_obj<float>(file_name);
    *tri_count = tri_vec.size();
    if (tri_vec.size() == 0)
        return NULL;
    tri* tris = reinterpret_cast<tri*>(malloc(sizeof(tri) * tri_vec.size()));
    for (size_t i = 0; i < tri_vec.size(); ++i) {
        tris[i].v[0].x = tri_vec[i].p0[0];
        tris[i].v[0].y = tri_vec[i].p0[1];
        tris[i].v[0].z = tri_vec[i].p0[2];
        tris[i].v[1].x = tri_vec[i].p1[0];
        tris[i].v[1].y = tri_vec[i].p1[1];
        tris[i].v[1].z = tri_vec[i].p1[2];
        tris[i].v[2].x = tri_vec[i].p2[0];
        tris[i].v[2].y = tri_vec[i].p2[1];
        tris[i].v[2].z = tri_vec[i].p2[2];
    }
    return tris;
}